

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_described(AMQP_VALUE descriptor,AMQP_VALUE value)

{
  AMQP_VALUE_DATA *pAVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  AMQP_VALUE_DATA *result;
  AMQP_VALUE value_local;
  AMQP_VALUE descriptor_local;
  
  pAVar1 = REFCOUNT_AMQP_VALUE_DATA_Create();
  if (pAVar1 == (AMQP_VALUE_DATA *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_described",0x1c2a,1,"Cannot allocate memory for described type");
    }
  }
  else {
    pAVar1->type = AMQP_TYPE_DESCRIBED;
    (pAVar1->value).described_value.descriptor = descriptor;
    (pAVar1->value).described_value.value = value;
  }
  return pAVar1;
}

Assistant:

AMQP_VALUE amqpvalue_create_described(AMQP_VALUE descriptor, AMQP_VALUE value)
{
    AMQP_VALUE_DATA* result = (AMQP_VALUE_DATA*)REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        LogError("Cannot allocate memory for described type");
    }
    else
    {
        result->type = AMQP_TYPE_DESCRIBED;
        result->value.described_value.descriptor = descriptor;
        result->value.described_value.value = value;
    }

    return result;
}